

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transporter.cpp
# Opt level: O2

void __thiscall
Transporter::Send(Transporter *this,uv_stream_t *handler,int cmd,char *data,size_t len)

{
  int iVar1;
  void *__s;
  char *base;
  uv_async_t *handle;
  size_t __n;
  size_t __size;
  uv_buf_t uVar2;
  char cmdValue [100];
  char local_98 [104];
  
  if (this->connected == true) {
    __s = operator_new(0xd8);
    memset(__s,0,0xd8);
    iVar1 = sprintf(local_98,"%d\n",(ulong)(uint)cmd);
    __n = (size_t)iVar1;
    __size = len + __n + 1;
    base = (char *)malloc(__size);
    memcpy(base,local_98,__n);
    memcpy(base + __n,data,len);
    base[len + __n] = '\n';
    uVar2 = uv_buf_init(base,(uint)__size);
    *(uv_buf_t *)((long)__s + 0xc0) = uVar2;
    *(uv_stream_t **)((long)__s + 0xd0) = handler;
    handle = (uv_async_t *)operator_new(0x80);
    handle->data = __s;
    uv_async_init(this->loop,handle,async_write);
    uv_async_send(handle);
  }
  return;
}

Assistant:

void Transporter::Send(uv_stream_t* handler, int cmd, const char* data, size_t len)
{
	if (!IsConnected())
	{
		return;
	}
	auto* writeReq = new write_req_t();
	char cmdValue[100];
	const int l1 = sprintf(cmdValue, "%d\n", cmd);
	const size_t newLen = len + l1 + 1;
	char* newData = static_cast<char*>(malloc(newLen));
	// line1
	memcpy(newData, cmdValue, l1);
	// line2
	memcpy(newData + l1, data, len);
	newData[newLen - 1] = '\n';
	writeReq->buf = uv_buf_init(newData, newLen);
	writeReq->handler = handler;

	// thread safe:
	auto* async = new uv_async_t;
	async->data = writeReq;
	uv_async_init(loop, async, async_write);
	uv_async_send(async);
}